

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_block_test.cc
# Opt level: O3

void __thiscall
leveldb::FilterBlockTest_EmptyBuilder_Test::TestBody(FilterBlockTest_EmptyBuilder_Test *this)

{
  int line;
  TestHashFilter *policy;
  undefined8 *puVar1;
  char *message;
  char *in_R9;
  FilterBlockReader reader;
  Slice block;
  FilterBlockBuilder builder;
  AssertHelper local_120;
  undefined8 *local_118;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_110;
  string local_108;
  AssertHelper local_e8;
  FilterBlockReader local_e0;
  Slice local_b8;
  FilterBlockBuilder local_a8;
  
  policy = &(this->super_FilterBlockTest).policy_;
  FilterBlockBuilder::FilterBlockBuilder(&local_a8,&policy->super_FilterPolicy);
  local_b8 = FilterBlockBuilder::Finish(&local_a8);
  EscapeString_abi_cxx11_((string *)&local_e0,(leveldb *)&local_b8,(Slice *)local_b8.size_);
  testing::internal::CmpHelperEQ<char[21],std::__cxx11::string>
            ((internal *)&local_108,"\"\\\\x00\\\\x00\\\\x00\\\\x00\\\\x0b\"","EscapeString(block)",
             (char (*) [21])"\\x00\\x00\\x00\\x00\\x0b",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e0);
  if (local_e0.policy_ != (FilterPolicy *)&local_e0.offset_) {
    operator_delete(local_e0.policy_);
  }
  if ((char)local_108._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_e0);
    if ((undefined8 *)local_108._M_string_length == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = *(char **)local_108._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/table/filter_block_test.cc"
               ,0x2f,message);
    testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    puVar1 = (undefined8 *)local_108._M_string_length;
    if (local_e0.policy_ != (FilterPolicy *)0x0) {
      (*(local_e0.policy_)->_vptr_FilterPolicy[1])();
      puVar1 = (undefined8 *)local_108._M_string_length;
    }
  }
  else {
    if ((undefined8 *)local_108._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_108._M_string_length !=
          (undefined8 *)(local_108._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_108._M_string_length);
      }
      operator_delete((void *)local_108._M_string_length);
    }
    FilterBlockReader::FilterBlockReader(&local_e0,&policy->super_FilterPolicy,&local_b8);
    local_108._M_dataplus._M_p = "foo";
    local_108._M_string_length = 3;
    local_120.data_._0_1_ =
         (internal)FilterBlockReader::KeyMayMatch(&local_e0,0,(Slice *)&local_108);
    local_118 = (undefined8 *)0x0;
    if ((bool)local_120.data_._0_1_) {
      local_108._M_dataplus._M_p = "foo";
      local_108._M_string_length = 3;
      local_120.data_._0_1_ =
           (internal)FilterBlockReader::KeyMayMatch(&local_e0,100000,(Slice *)&local_108);
      local_118 = (undefined8 *)0x0;
      if ((bool)local_120.data_._0_1_) goto LAB_0010798d;
      testing::Message::Message((Message *)&local_110);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_108,(internal *)&local_120,
                 (AssertionResult *)"reader.KeyMayMatch(100000, \"foo\")","false","true",in_R9);
      line = 0x32;
    }
    else {
      testing::Message::Message((Message *)&local_110);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_108,(internal *)&local_120,
                 (AssertionResult *)"reader.KeyMayMatch(0, \"foo\")","false","true",in_R9);
      line = 0x31;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/table/filter_block_test.cc"
               ,line,local_108._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p);
    }
    puVar1 = local_118;
    if (local_110._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_110._M_head_impl + 8))();
      puVar1 = local_118;
    }
  }
  if (puVar1 != (undefined8 *)0x0) {
    if ((undefined8 *)*puVar1 != puVar1 + 2) {
      operator_delete((undefined8 *)*puVar1);
    }
    operator_delete(puVar1);
  }
LAB_0010798d:
  if (local_a8.filter_offsets_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.filter_offsets_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_a8.tmp_keys_.super__Vector_base<leveldb::Slice,_std::allocator<leveldb::Slice>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.tmp_keys_.
                    super__Vector_base<leveldb::Slice,_std::allocator<leveldb::Slice>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.result_._M_dataplus._M_p != &local_a8.result_.field_2) {
    operator_delete(local_a8.result_._M_dataplus._M_p);
  }
  if (local_a8.start_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.start_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.keys_._M_dataplus._M_p != &local_a8.keys_.field_2) {
    operator_delete(local_a8.keys_._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST_F(FilterBlockTest, EmptyBuilder) {
  FilterBlockBuilder builder(&policy_);
  Slice block = builder.Finish();
  ASSERT_EQ("\\x00\\x00\\x00\\x00\\x0b", EscapeString(block));
  FilterBlockReader reader(&policy_, block);
  ASSERT_TRUE(reader.KeyMayMatch(0, "foo"));
  ASSERT_TRUE(reader.KeyMayMatch(100000, "foo"));
}